

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O0

void baryonyx::error<int,int>(context *ctx,char *fmt,int *arg1,int *args)

{
  bool bVar1;
  int *in_R9;
  int *args_local;
  int *arg1_local;
  char *fmt_local;
  context *ctx_local;
  
  bVar1 = is_loggable(ctx->log_priority,3);
  if (bVar1) {
    log<int,int>(_stderr,(FILE *)0x3,(int)fmt,(char *)arg1,args,in_R9);
  }
  return;
}

Assistant:

void
error(const context& ctx,
      const char* fmt,
      const Arg1& arg1,
      const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
    if (!is_loggable(ctx.log_priority, 3))
        return;

    log(stderr, 3, fmt, arg1, args...);
#else
    detail::sink(ctx, fmt, arg1, args...);
#endif
}